

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_isResolvedUnitsOverOneLevel_Test::~Importer_isResolvedUnitsOverOneLevel_Test
          (Importer_isResolvedUnitsOverOneLevel_Test *this)

{
  Importer_isResolvedUnitsOverOneLevel_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsOverOneLevel)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/units_definition_level_1.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->libraryCount());
    EXPECT_EQ(resourcePath("importer/units_source.cellml"), importer->key(0));

    auto units1 = model->units(0);
    auto units2 = model->units(1);

    EXPECT_TRUE(units1->isResolved());
    EXPECT_FALSE(units2->isResolved());

    EXPECT_TRUE(model->hasUnresolvedImports());
}